

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.hpp
# Opt level: O2

void __thiscall csv::internals::MmapParser::~MmapParser(MmapParser *this)

{
  (this->super_IBasicCSVParser)._vptr_IBasicCSVParser = (_func_int **)&PTR__MmapParser_00114cc8;
  std::__cxx11::string::~string((string *)&this->_filename);
  IBasicCSVParser::~IBasicCSVParser(&this->super_IBasicCSVParser);
  return;
}

Assistant:

~MmapParser() {}